

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O1

int Bdc_SpfdMark1(Bdc_Ent_t *p,Bdc_Ent_t *pEnt)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    uVar1 = *(ulong *)pEnt;
    if ((long)uVar1 < 0) {
      return iVar4;
    }
    uVar2 = (uint)uVar1 & 0x1fffffff;
    if (uVar2 == 0x1fffffff) break;
    *(ulong *)pEnt = uVar1 | 0x8000000000000000;
    iVar3 = Bdc_SpfdMark1(p,p + uVar2);
    pEnt = p + (*(uint *)&pEnt->field_0x4 & 0x1fffffff);
    iVar4 = (iVar4 - ((int)(uint)uVar1 >> 0x1f)) + iVar3;
  }
  return iVar4;
}

Assistant:

int Bdc_SpfdMark1( Bdc_Ent_t * p, Bdc_Ent_t * pEnt )
{
    if ( pEnt->iFan0 == BDC_TERM )
        return 0;
    if ( pEnt->fMark1 )
        return 0;
    pEnt->fMark1 = 1;
    return pEnt->fMark0 + 
        Bdc_SpfdMark1(p, p + pEnt->iFan0) + 
        Bdc_SpfdMark1(p, p + pEnt->iFan1);
}